

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool op_smlald(DisasContext_conflict1 *s,arg_rrrr *a,_Bool m_swap,_Bool sub)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int iVar1;
  TCGv_i32 a_00;
  TCGv_i32 var;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 l2;
  TCGv_i64 l1;
  TCGv_i32 t2;
  TCGv_i32 t1;
  TCGContext_conflict1 *tcg_ctx;
  _Bool sub_local;
  _Bool m_swap_local;
  arg_rrrr *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = arm_dc_feature(s,3);
  if (iVar1 == 0) {
    s_local._7_1_ = false;
  }
  else {
    a_00 = load_reg(s,a->rn);
    var = load_reg(s,a->rm);
    if (m_swap) {
      gen_swap_half(tcg_ctx_00,var);
    }
    gen_smul_dual(tcg_ctx_00,a_00,var);
    ret = tcg_temp_new_i64(tcg_ctx_00);
    ret_00 = tcg_temp_new_i64(tcg_ctx_00);
    tcg_gen_ext_i32_i64_aarch64(tcg_ctx_00,ret,a_00);
    tcg_gen_ext_i32_i64_aarch64(tcg_ctx_00,ret_00,var);
    tcg_temp_free_i32(tcg_ctx_00,a_00);
    tcg_temp_free_i32(tcg_ctx_00,var);
    if (sub) {
      tcg_gen_sub_i64(tcg_ctx_00,ret,ret,ret_00);
    }
    else {
      tcg_gen_add_i64(tcg_ctx_00,ret,ret,ret_00);
    }
    tcg_temp_free_i64(tcg_ctx_00,ret_00);
    gen_addq(s,ret,a->ra,a->rd);
    gen_storeq_reg(s,a->ra,a->rd,ret);
    tcg_temp_free_i64(tcg_ctx_00,ret);
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool op_smlald(DisasContext *s, arg_rrrr *a, bool m_swap, bool sub)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t1, t2;
    TCGv_i64 l1, l2;

    if (!ENABLE_ARCH_6) {
        return false;
    }

    t1 = load_reg(s, a->rn);
    t2 = load_reg(s, a->rm);
    if (m_swap) {
        gen_swap_half(tcg_ctx, t2);
    }
    gen_smul_dual(tcg_ctx, t1, t2);

    l1 = tcg_temp_new_i64(tcg_ctx);
    l2 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_ext_i32_i64(tcg_ctx, l1, t1);
    tcg_gen_ext_i32_i64(tcg_ctx, l2, t2);
    tcg_temp_free_i32(tcg_ctx, t1);
    tcg_temp_free_i32(tcg_ctx, t2);

    if (sub) {
        tcg_gen_sub_i64(tcg_ctx, l1, l1, l2);
    } else {
        tcg_gen_add_i64(tcg_ctx, l1, l1, l2);
    }
    tcg_temp_free_i64(tcg_ctx, l2);

    gen_addq(s, l1, a->ra, a->rd);
    gen_storeq_reg(s, a->ra, a->rd, l1);
    tcg_temp_free_i64(tcg_ctx, l1);
    return true;
}